

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiling_info-c.cpp
# Opt level: O3

duckdb_profiling_info duckdb_profiling_info_get_child(duckdb_profiling_info info,idx_t index)

{
  reference pvVar1;
  
  if ((info != (duckdb_profiling_info)0x0) &&
     (index < (ulong)(*(long *)(info + 0x110) - *(long *)(info + 0x108) >> 3))) {
    pvVar1 = duckdb::
             vector<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_true>
                           *)(info + 0x108),index);
    return (duckdb_profiling_info)
           (pvVar1->
           super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>).
           _M_t.
           super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>
           .super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl;
  }
  return (duckdb_profiling_info)0x0;
}

Assistant:

duckdb_profiling_info duckdb_profiling_info_get_child(duckdb_profiling_info info, idx_t index) {
	if (!info) {
		return nullptr;
	}
	auto &node = *reinterpret_cast<duckdb::ProfilingNode *>(info);
	if (index >= node.GetChildCount()) {
		return nullptr;
	}

	ProfilingNode *profiling_info_ptr = node.GetChild(index).get();
	return reinterpret_cast<duckdb_profiling_info>(profiling_info_ptr);
}